

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_sub_signed_Test::TestBody(correctness_sub_signed_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_140;
  AssertionResult gtest_ar_;
  big_integer local_128;
  AssertionResult gtest_ar__1;
  big_integer a;
  big_integer b;
  big_integer local_48;
  
  big_integer::big_integer(&a,5);
  big_integer::big_integer(&b,0x14);
  big_integer::big_integer(&local_48,&a);
  operator-(&local_128,&local_48,&b);
  big_integer::big_integer((big_integer *)&gtest_ar__1,-0xf);
  gtest_ar_.success_ = operator==(&local_128,(big_integer *)&gtest_ar__1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  big_integer::~big_integer((big_integer *)&gtest_ar__1);
  big_integer::~big_integer(&local_128);
  big_integer::~big_integer(&local_48);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_128,(internal *)&gtest_ar_,(AssertionResult *)"a - b == -15","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x9d,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  big_integer::operator-=(&a,&b);
  big_integer::big_integer(&local_128,-0xf);
  gtest_ar__1.success_ = operator==(&a,&local_128);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  big_integer::~big_integer(&local_128);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_128,(internal *)&gtest_ar__1,(AssertionResult *)"a == -15","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0xa0,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  big_integer::big_integer(&local_128,-100);
  big_integer::operator-=(&a,&local_128);
  big_integer::~big_integer(&local_128);
  big_integer::big_integer(&local_128,0x55);
  bVar1 = operator==(&a,&local_128);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = bVar1;
  big_integer::~big_integer(&local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_128,(internal *)&gtest_ar__1,(AssertionResult *)"a == 85","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0xa3,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_128);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, sub_signed)
{
    big_integer a = 5;
    big_integer b = 20;

    EXPECT_TRUE(a - b == -15);

    a -= b;
    EXPECT_TRUE(a == -15);

    a -= -100;
    EXPECT_TRUE(a == 85);
}